

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

void xmlParserPrintFileContextInternal(xmlParserInputPtr input,xmlGenericErrorFunc chanl,void *data)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  uint uVar5;
  xmlChar content [81];
  xmlChar local_68 [88];
  
  if (input == (xmlParserInputPtr)0x0) {
    return;
  }
  pxVar2 = input->cur;
  for (pxVar3 = pxVar2; (input->base < pxVar3 && ((*pxVar3 == '\r' || (*pxVar3 == '\n'))));
      pxVar3 = pxVar3 + -1) {
  }
  uVar5 = 0;
  for (; (xVar1 = *pxVar3, uVar5 < 0x50 && (input->base < pxVar3)); pxVar3 = pxVar3 + -1) {
    if ((xVar1 == '\n') || (xVar1 == '\r')) goto LAB_001030a8;
    uVar5 = uVar5 + 1;
  }
  if ((xVar1 == '\n') || (xVar1 == '\r')) {
LAB_001030a8:
    pxVar3 = pxVar3 + 1;
  }
  for (lVar4 = 0;
      (((xVar1 = pxVar3[lVar4], xVar1 != '\0' && (xVar1 != '\n')) && (xVar1 != '\r')) &&
      ((uint)lVar4 < 0x50)); lVar4 = lVar4 + 1) {
    local_68[lVar4] = xVar1;
  }
  local_68[lVar4] = '\0';
  lVar4 = 0;
  channel(input,"%s\n",local_68);
  do {
    if (((int)pxVar2 - (int)pxVar3 == (int)lVar4) || ((int)lVar4 == 0x4f)) goto LAB_0010310b;
    if (local_68[lVar4] != '\t') {
      if (local_68[lVar4] == '\0') {
LAB_0010310b:
        (local_68 + lVar4)[0] = '^';
        (local_68 + lVar4)[1] = '\0';
        channel(input,"%s\n",local_68);
        return;
      }
      local_68[lVar4] = ' ';
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc chanl, void *data ) {
    const xmlChar *cur, *base;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if (input == NULL) return;
    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n++ < (sizeof(content)-1)) && (cur > base) &&
   (*(cur) != '\n') && (*(cur) != '\r'))
        cur--;
    if ((*(cur) == '\n') || (*(cur) == '\r')) cur++;
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    ctnt = content;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') &&
   (*(cur) != '\r') && (n < sizeof(content)-1)) {
		*ctnt++ = *cur++;
	n++;
    }
    *ctnt = 0;
    /* print out the selected text */
    chanl(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    chanl(data ,"%s\n", content);
}